

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

bool __thiscall cs::token_literal::dump(token_literal *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(in_RSI,"< Literal = \"");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x10));
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x30));
  std::operator<<(poVar1," >");
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< Literal = \"" << m_data << "\"" << m_literal << " >";
			return true;
		}